

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

void commit_ll(D_Scope *st,D_SymHash *sh)

{
  D_Sym *pDVar1;
  D_Sym *s;
  
  if (st->search != (D_Scope *)0x0) {
    commit_ll(st->search,sh);
    s = st->ll;
    while (s != (D_Sym *)0x0) {
      pDVar1 = s->next;
      symhash_add(sh,s);
      st->ll = pDVar1;
      s = pDVar1;
    }
  }
  return;
}

Assistant:

static void commit_ll(D_Scope *st, D_SymHash *sh) {
  D_Sym *sym;
  if (st->search) {
    commit_ll(st->search, sh);
    for (; st->ll; st->ll = sym) {
      sym = st->ll->next;
      symhash_add(sh, st->ll);
    }
  }
}